

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86.cpp
# Opt level: O1

int __thiscall
ncnn::ConvolutionDepthWise_x86::load_model(ConvolutionDepthWise_x86 *this,ModelBin *mb)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int iVar7;
  undefined4 uVar8;
  pointer ppLVar9;
  Layer *pLVar10;
  pointer ppLVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  int iVar16;
  Mat weight_data_g;
  ParamDict pd;
  ModelBinFromMatArray local_6f8;
  size_t local_6e8;
  Allocator *local_6e0;
  undefined1 local_6d8 [16];
  undefined8 local_6c8;
  int local_6bc;
  undefined1 local_6b8 [16];
  undefined1 local_6a8 [16];
  undefined1 local_698 [16];
  long local_688;
  int local_67c;
  undefined1 local_678 [16];
  size_t local_668;
  Allocator *pAStack_660;
  undefined1 local_658 [16];
  size_t local_648;
  long local_640;
  size_t local_638;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *local_630;
  undefined1 local_628 [48];
  size_t local_5f8;
  undefined1 local_5f0 [16];
  undefined8 local_5e0;
  long *plStack_5d8;
  undefined1 local_5d0 [16];
  long local_5c0;
  ModelBinFromMatArray local_5b8;
  size_t local_5a8;
  Allocator *local_5a0;
  undefined8 local_598;
  undefined8 uStack_590;
  undefined8 local_588;
  ModelBinFromMatArray local_580;
  size_t local_570;
  Allocator *local_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 local_550;
  undefined1 local_548 [36];
  int iStack_524;
  Allocator *local_518 [157];
  
  iVar7 = ConvolutionDepthWise::load_model(&this->super_ConvolutionDepthWise,mb);
  if (iVar7 == 0) {
    iVar7 = (this->super_ConvolutionDepthWise).num_output;
    iVar12 = (this->super_ConvolutionDepthWise).kernel_h *
             (this->super_ConvolutionDepthWise).kernel_w;
    iVar16 = (this->super_ConvolutionDepthWise).group;
    uVar4 = (long)(this->super_ConvolutionDepthWise).weight_data_size / (long)iVar16;
    uVar4 = (long)((ulong)(uint)((int)uVar4 >> 0x1f) << 0x20 | uVar4 & 0xffffffff) / (long)iVar12;
    ppLVar11 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    ppLVar9 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (0 < (int)((ulong)((long)ppLVar11 - (long)ppLVar9) >> 3)) {
      lVar14 = 0;
      do {
        if (ppLVar9[lVar14] != (Layer *)0x0) {
          (*ppLVar9[lVar14]->_vptr_Layer[1])();
        }
        lVar14 = lVar14 + 1;
        ppLVar9 = (this->group_ops).
                  super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        ppLVar11 = (this->group_ops).
                   super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                   super__Vector_impl_data._M_finish;
      } while (lVar14 < (int)((ulong)((long)ppLVar11 - (long)ppLVar9) >> 3));
    }
    iVar16 = (int)((long)((ulong)(uint)((int)uVar4 >> 0x1f) << 0x20 | uVar4 & 0xffffffff) /
                  (long)(iVar7 / iVar16)) * iVar16;
    if (ppLVar11 != ppLVar9) {
      (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppLVar9;
    }
    iVar7 = (this->super_ConvolutionDepthWise).group;
    iVar13 = (this->super_ConvolutionDepthWise).num_output;
    if (((iVar16 == iVar7) &&
        (auVar5._4_4_ = -(uint)((this->super_ConvolutionDepthWise).kernel_w == 3),
        auVar5._0_4_ = -(uint)(iVar7 == iVar13),
        auVar5._8_4_ = -(uint)((this->super_ConvolutionDepthWise).kernel_h == 3),
        auVar5._12_4_ = -(uint)((this->super_ConvolutionDepthWise).dilation_w == 1),
        uVar8 = movmskps((int)ppLVar9,auVar5), (char)uVar8 == '\x0f')) &&
       ((this->super_ConvolutionDepthWise).dilation_h == 1)) {
      iVar1 = (this->super_ConvolutionDepthWise).stride_w;
      iVar2 = (this->super_ConvolutionDepthWise).stride_h;
      if (iVar2 == 1 && iVar1 == 1) {
        return 0;
      }
      if (iVar2 == 2 && iVar1 == 2) {
        return 0;
      }
    }
    local_630 = &this->group_ops;
    iVar13 = iVar13 / iVar7;
    std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize(local_630,(long)iVar7);
    if ((this->super_ConvolutionDepthWise).group < 1) {
      iVar7 = 0;
    }
    else {
      local_67c = (iVar16 / iVar7) * iVar12 * iVar13;
      local_638 = (size_t)local_67c;
      local_640 = (long)iVar13;
      lVar14 = 0;
      local_6bc = iVar13;
      do {
        local_668 = (this->super_ConvolutionDepthWise).weight_data.elemsize;
        pAStack_660 = (this->super_ConvolutionDepthWise).weight_data.allocator;
        local_678._8_8_ = 0;
        local_678._0_8_ =
             (void *)(lVar14 * local_638 * local_668 +
                     (long)(this->super_ConvolutionDepthWise).weight_data.data);
        local_658._4_4_ = (int)local_638;
        local_658._0_4_ = 1;
        local_658._8_8_ = 0x100000001;
        local_688 = 0;
        local_698 = (undefined1  [16])0x0;
        local_6a8 = (undefined1  [16])0x0;
        local_6b8 = (undefined1  [16])0x0;
        if ((this->super_ConvolutionDepthWise).bias_term != 0) {
          local_548._24_8_ = (this->super_ConvolutionDepthWise).bias_data.allocator;
          local_6a8._0_8_ = (this->super_ConvolutionDepthWise).bias_data.elemsize;
          local_6a8._8_8_ = (this->super_ConvolutionDepthWise).bias_data.allocator;
          local_548._8_8_ = 0;
          local_548._0_8_ =
               (void *)(lVar14 * local_640 * (this->super_ConvolutionDepthWise).bias_data.elemsize +
                       (long)(this->super_ConvolutionDepthWise).bias_data.data);
          stack0xfffffffffffffad8 = (int *)CONCAT44(local_6bc,1);
          local_698._8_8_ = 0x100000001;
          local_698._0_8_ = stack0xfffffffffffffad8;
          local_688 = local_640;
          local_6b8 = local_548._0_16_;
          local_548._0_16_ = (undefined1  [16])0x0;
          local_548._16_4_ = 0;
          local_548._20_4_ = (anon_union_4_2_947300a4_for_anon_struct_64_3_9ed89b7b_1)0x0;
          local_518[0] = (Allocator *)0x0;
          stack0xfffffffffffffad8 = (undefined1  [16])0x0;
        }
        local_648 = local_638;
        pLVar10 = create_layer(6);
        ParamDict::ParamDict((ParamDict *)local_548);
        ParamDict::set((ParamDict *)local_548,0,local_6bc);
        ParamDict::set((ParamDict *)local_548,1,(this->super_ConvolutionDepthWise).kernel_w);
        ParamDict::set((ParamDict *)local_548,0xb,(this->super_ConvolutionDepthWise).kernel_h);
        ParamDict::set((ParamDict *)local_548,2,(this->super_ConvolutionDepthWise).dilation_w);
        ParamDict::set((ParamDict *)local_548,0xc,(this->super_ConvolutionDepthWise).dilation_h);
        ParamDict::set((ParamDict *)local_548,3,(this->super_ConvolutionDepthWise).stride_w);
        ParamDict::set((ParamDict *)local_548,0xd,(this->super_ConvolutionDepthWise).stride_h);
        ParamDict::set((ParamDict *)local_548,4,0);
        ParamDict::set((ParamDict *)local_548,0xe,0);
        ParamDict::set((ParamDict *)local_548,5,(this->super_ConvolutionDepthWise).bias_term);
        ParamDict::set((ParamDict *)local_548,6,local_67c);
        ParamDict::set((ParamDict *)local_548,8,(this->super_ConvolutionDepthWise).int8_scale_term);
        (*pLVar10->_vptr_Layer[2])(pLVar10);
        memset(local_628,0,0xe0);
        if ((int *)local_678._8_8_ != (int *)0x0) {
          LOCK();
          *(int *)local_678._8_8_ = *(int *)local_678._8_8_ + 1;
          UNLOCK();
        }
        if ((int *)local_628._8_8_ != (int *)0x0) {
          LOCK();
          *(int *)local_628._8_8_ = *(int *)local_628._8_8_ + -1;
          UNLOCK();
          if (*(int *)local_628._8_8_ == 0) {
            if ((Allocator *)local_628._24_8_ == (Allocator *)0x0) {
              if ((void *)local_628._0_8_ != (void *)0x0) {
                free(*(void **)(local_628._0_8_ + -8));
              }
            }
            else {
              (**(code **)(*(long *)local_628._24_8_ + 8))();
            }
          }
        }
        local_628._0_16_ = local_678;
        local_628._16_8_ = local_668;
        local_628._24_8_ = pAStack_660;
        local_628._32_16_ = local_658;
        local_5f8 = local_648;
        if ((int *)local_6b8._8_8_ != (int *)0x0) {
          LOCK();
          *(int *)local_6b8._8_8_ = *(int *)local_6b8._8_8_ + 1;
          UNLOCK();
        }
        if ((int *)local_5f0._8_8_ != (int *)0x0) {
          LOCK();
          *(int *)local_5f0._8_8_ = *(int *)local_5f0._8_8_ + -1;
          UNLOCK();
          if (*(int *)local_5f0._8_8_ == 0) {
            if (plStack_5d8 == (long *)0x0) {
              if (local_5f0._0_8_ != 0) {
                free(*(void **)(local_5f0._0_8_ + -8));
              }
            }
            else {
              (**(code **)(*plStack_5d8 + 8))();
            }
          }
        }
        local_5f0 = local_6b8;
        local_5e0 = local_6a8._0_8_;
        plStack_5d8 = (long *)local_6a8._8_8_;
        local_5d0 = local_698;
        local_5c0 = local_688;
        if ((this->super_ConvolutionDepthWise).int8_scale_term != 0) {
          local_6e8 = (this->super_ConvolutionDepthWise).weight_data_int8_scales.elemsize;
          local_6e0 = (this->super_ConvolutionDepthWise).weight_data_int8_scales.allocator;
          local_6f8.weights = (Mat *)0x0;
          local_6f8.super_ModelBin._vptr_ModelBin =
               (_func_int **)
               (local_6e8 * lVar14 +
               (long)(this->super_ConvolutionDepthWise).weight_data_int8_scales.data);
          local_6d8._0_8_ = 0x100000001;
          local_6d8._8_8_ = 0x100000001;
          local_6c8 = 1;
          if (local_5b8.weights != (Mat *)0x0) {
            LOCK();
            *(int *)&(local_5b8.weights)->data = *(int *)&(local_5b8.weights)->data + -1;
            UNLOCK();
            if (*(int *)&(local_5b8.weights)->data == 0) {
              if (local_5a0 == (Allocator *)0x0) {
                if (local_5b8.super_ModelBin._vptr_ModelBin != (_func_int **)0x0) {
                  free(local_5b8.super_ModelBin._vptr_ModelBin[-1]);
                }
              }
              else {
                (**(code **)(*(long *)local_5a0 + 8))();
              }
            }
          }
          local_5b8 = local_6f8;
          local_5a8 = local_6e8;
          local_5a0 = local_6e0;
          uStack_590 = local_6d8._8_8_;
          local_598 = local_6d8._0_8_;
          local_588 = local_6c8;
          if (local_6f8.weights != (Mat *)0x0) {
            LOCK();
            *(int *)&(local_6f8.weights)->data = *(int *)&(local_6f8.weights)->data + -1;
            UNLOCK();
            if (*(int *)&(local_6f8.weights)->data == 0) {
              if (local_6e0 == (Allocator *)0x0) {
                if (local_6f8.super_ModelBin._vptr_ModelBin != (_func_int **)0x0) {
                  free(local_6f8.super_ModelBin._vptr_ModelBin[-1]);
                }
              }
              else {
                (**(code **)(*(long *)local_6e0 + 8))();
              }
            }
          }
          local_6e8 = (this->super_ConvolutionDepthWise).bottom_blob_int8_scales.elemsize;
          local_6e0 = (this->super_ConvolutionDepthWise).bottom_blob_int8_scales.allocator;
          local_6f8.weights = (Mat *)0x0;
          local_6f8.super_ModelBin._vptr_ModelBin =
               (_func_int **)
               (local_6e8 * lVar14 +
               (long)(this->super_ConvolutionDepthWise).bottom_blob_int8_scales.data);
          local_6d8._0_8_ = 0x100000001;
          local_6d8._8_8_ = 0x100000001;
          local_6c8 = 1;
          if (local_580.weights != (Mat *)0x0) {
            LOCK();
            *(int *)&(local_580.weights)->data = *(int *)&(local_580.weights)->data + -1;
            UNLOCK();
            if (*(int *)&(local_580.weights)->data == 0) {
              if (local_568 == (Allocator *)0x0) {
                if (local_580.super_ModelBin._vptr_ModelBin != (_func_int **)0x0) {
                  free(local_580.super_ModelBin._vptr_ModelBin[-1]);
                }
              }
              else {
                (**(code **)(*(long *)local_568 + 8))();
              }
            }
          }
          local_580 = local_6f8;
          local_570 = local_6e8;
          local_568 = local_6e0;
          uStack_558 = local_6d8._8_8_;
          local_560 = local_6d8._0_8_;
          local_550 = local_6c8;
          if (local_6f8.weights != (Mat *)0x0) {
            LOCK();
            *(int *)&(local_6f8.weights)->data = *(int *)&(local_6f8.weights)->data + -1;
            UNLOCK();
            if (*(int *)&(local_6f8.weights)->data == 0) {
              if (local_6e0 == (Allocator *)0x0) {
                if (local_6f8.super_ModelBin._vptr_ModelBin != (_func_int **)0x0) {
                  free(local_6f8.super_ModelBin._vptr_ModelBin[-1]);
                }
              }
              else {
                (**(code **)(*(long *)local_6e0 + 8))();
              }
            }
          }
          local_6f8.super_ModelBin._vptr_ModelBin = (_func_int **)0x0;
          local_6f8.weights = (Mat *)0x0;
          local_6e8 = 0;
          local_6c8 = 0;
          local_6d8 = (undefined1  [16])0x0;
        }
        ModelBinFromMatArray::ModelBinFromMatArray(&local_6f8,(Mat *)local_628);
        (*pLVar10->_vptr_Layer[3])(pLVar10,&local_6f8);
        (local_630->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
        super__Vector_impl_data._M_start[lVar14] = pLVar10;
        lVar15 = 0xa8;
        do {
          piVar3 = *(int **)(local_628 + lVar15 + 8);
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              if (*(long **)(local_628 + lVar15 + 0x18) == (long *)0x0) {
                if (*(long *)(local_628 + lVar15) != 0) {
                  free(*(void **)(*(long *)(local_628 + lVar15) + -8));
                }
              }
              else {
                (**(code **)(**(long **)(local_628 + lVar15 + 0x18) + 8))();
              }
            }
          }
          *(undefined1 (*) [16])(local_628 + lVar15) = (undefined1  [16])0x0;
          *(undefined8 *)(local_628 + lVar15 + 0x10) = 0;
          *(undefined8 *)(local_5f0 + lVar15 + -8) = 0;
          *(undefined1 (*) [16])(local_628 + lVar15 + 0x20) = (undefined1  [16])0x0;
          lVar15 = lVar15 + -0x38;
        } while (lVar15 != -0x38);
        lVar15 = 0x4d8;
        do {
          piVar3 = *(int **)(local_548 + lVar15 + 8);
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              if (*(long **)(local_548 + lVar15 + 0x18) == (long *)0x0) {
                if (*(long *)(local_548 + lVar15) != 0) {
                  free(*(void **)(*(long *)(local_548 + lVar15) + -8));
                }
              }
              else {
                (**(code **)(**(long **)(local_548 + lVar15 + 0x18) + 8))();
              }
            }
          }
          *(undefined1 (*) [16])(local_548 + lVar15) = (undefined1  [16])0x0;
          *(undefined8 *)(local_548 + lVar15 + 0x10) = 0;
          *(undefined8 *)((long)local_518 + lVar15) = 0;
          *(undefined1 (*) [16])(local_548 + lVar15 + 0x20) = (undefined1  [16])0x0;
          lVar15 = lVar15 + -0x40;
        } while (lVar15 != -0x28);
        if ((int *)local_6b8._8_8_ != (int *)0x0) {
          LOCK();
          *(int *)local_6b8._8_8_ = *(int *)local_6b8._8_8_ + -1;
          UNLOCK();
          if (*(int *)local_6b8._8_8_ == 0) {
            if ((long *)local_6a8._8_8_ == (long *)0x0) {
              if (local_6b8._0_8_ != 0) {
                free(*(void **)(local_6b8._0_8_ + -8));
              }
            }
            else {
              (**(code **)(*(long *)local_6a8._8_8_ + 8))();
            }
          }
        }
        local_6b8 = (undefined1  [16])0x0;
        auVar6._8_8_ = 0;
        auVar6._0_8_ = local_6a8._8_8_;
        local_6a8 = auVar6 << 0x40;
        local_688 = 0;
        local_698 = (undefined1  [16])0x0;
        if ((int *)local_678._8_8_ != (int *)0x0) {
          LOCK();
          *(int *)local_678._8_8_ = *(int *)local_678._8_8_ + -1;
          UNLOCK();
          if (*(int *)local_678._8_8_ == 0) {
            if (pAStack_660 == (Allocator *)0x0) {
              if (local_678._0_8_ != 0) {
                free(*(void **)(local_678._0_8_ + -8));
              }
            }
            else {
              (**(code **)(*(long *)pAStack_660 + 8))();
            }
          }
        }
        iVar7 = 0;
        lVar14 = lVar14 + 1;
      } while (lVar14 < (this->super_ConvolutionDepthWise).group);
    }
  }
  return iVar7;
}

Assistant:

int ConvolutionDepthWise_x86::load_model(const ModelBin& mb)
{
    int ret = ConvolutionDepthWise::load_model(mb);
    if (ret != 0)
        return ret;

    // create Convolution op for each group
    const int maxk = kernel_w * kernel_h;
    int channels = (weight_data_size / group) / maxk / (num_output / group) * group;

    for (int i=0; i<(int)group_ops.size(); i++)
        delete group_ops[i];

    group_ops.clear();

    if (channels == group && group == num_output)
    {
        // depth-wise specific
        if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1)
        {
            if ((stride_w == 1 && stride_h == 1) || (stride_w == 2 && stride_h == 2))
            {
                return 0;
            }
        }
    }

    const int channels_g = channels / group;
    const int num_output_g = num_output / group;

    group_ops.resize(group);

    for (int g=0; g<group; g++)
    {
        Mat weight_data_g = weight_data.range(maxk * channels_g * num_output_g * g, maxk * channels_g * num_output_g);
        Mat bias_data_g;
        if (bias_term)
            bias_data_g = bias_data.range(num_output_g * g, num_output_g);

        ncnn::Layer* op = ncnn::create_layer(ncnn::LayerType::Convolution);

        // set param
        ncnn::ParamDict pd;
        pd.set(0, num_output_g);// num_output
        pd.set(1, kernel_w);
        pd.set(11, kernel_h);
        pd.set(2, dilation_w);
        pd.set(12, dilation_h);
        pd.set(3, stride_w);
        pd.set(13, stride_h);
        pd.set(4, 0);// pad_w
        pd.set(14, 0);// pad_h
        pd.set(5, bias_term);
        pd.set(6, maxk * channels_g * num_output_g);// weight_data_size
        pd.set(8, int8_scale_term);

        op->load_param(pd);

        // set weights
        ncnn::Mat weights[4];
        weights[0] = weight_data_g;
        weights[1] = bias_data_g;

        if (int8_scale_term)
        {
            weights[2] = weight_data_int8_scales.range(g, 1);
            weights[3] = bottom_blob_int8_scales.range(g, 1);
        }

        op->load_model(ModelBinFromMatArray(weights));

        group_ops[g] = op;
    }

    return 0;
}